

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int btreeBeginTrans(Btree *p,int wrflag,int *pSchemaVersion)

{
  ushort uVar1;
  undefined2 uVar2;
  Pgno PVar3;
  BtShared *pBt;
  Pager *pPager;
  BtLock *pBVar4;
  u8 *puVar5;
  MemPage *pMVar6;
  uint uVar7;
  char cVar8;
  byte bVar9;
  u16 uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  u32 uVar14;
  u32 uVar15;
  u32 uVar16;
  BtLock **ppBVar17;
  Btree *pBVar18;
  uint uVar19;
  Wal *pWal;
  undefined1 auVar20 [16];
  int local_48;
  Pgno local_44;
  u32 *local_40;
  MemPage *pPage1;
  
  pBt = p->pBt;
  pPager = pBt->pPager;
  sqlite3BtreeEnter(p);
  if ((p->inTrans == '\x02') || (wrflag == 0 && p->inTrans == '\x01')) {
LAB_00139188:
    if (pSchemaVersion != (int *)0x0) {
      uVar16 = sqlite3Get4byte(pBt->pPage1->aData + 0x28);
      *pSchemaVersion = uVar16;
    }
    if (wrflag == 0) {
      uVar11 = 0;
    }
    else {
      uVar11 = sqlite3PagerOpenSavepoint(pPager,p->db->nSavepoint);
    }
    goto LAB_001391bf;
  }
  if (((p->db->flags & 0x2000000) != 0) && (pPager->readOnly == '\0')) {
    *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags & 0xfe;
  }
  if ((wrflag != 0) && ((pBt->btsFlags & 1) != 0)) {
    uVar11 = 8;
    goto LAB_001391bf;
  }
  cVar8 = (char)pBt->btsFlags;
  if (wrflag == 0) {
    if (cVar8 < '\0') goto LAB_00138bf2;
  }
  else {
    if ((cVar8 < '\0') || (pBt->inTransaction == '\x02')) {
LAB_00138bf2:
      pBVar18 = pBt->pWriter;
    }
    else {
      if (wrflag < 2) goto LAB_00138c0a;
      ppBVar17 = &pBt->pLock;
      do {
        pBVar4 = *ppBVar17;
        if (pBVar4 == (BtLock *)0x0) goto LAB_00138c0a;
        pBVar18 = pBVar4->pBtree;
        ppBVar17 = &pBVar4->pNext;
      } while (pBVar18 == p);
    }
    uVar11 = 0x106;
    if (pBVar18->db != (sqlite3 *)0x0) goto LAB_001391bf;
  }
LAB_00138c0a:
  uVar11 = querySharedCacheTableLock(p,1,'\x01');
  if (uVar11 == 0) {
    uVar1 = pBt->btsFlags;
    pBt->btsFlags = uVar1 & 0xffef;
    if (pBt->nPage == 0) {
      pBt->btsFlags = uVar1 | 0x10;
    }
    local_40 = &pBt->pageSize;
    uVar11 = 0;
LAB_00138c4d:
    do {
      if (pBt->pPage1 == (MemPage *)0x0) {
        uVar12 = sqlite3PagerSharedLock(pBt->pPager);
        if ((uVar12 != 0) || (uVar12 = btreeGetPage(pBt,1,&pPage1,0), pMVar6 = pPage1, uVar12 != 0))
        goto LAB_00138f01;
        puVar5 = pPage1->aData;
        uVar16 = sqlite3Get4byte(puVar5 + 0x1c);
        PVar3 = pBt->pPager->dbSize;
        if ((uVar16 == 0) || (*(int *)(puVar5 + 0x18) != *(int *)(puVar5 + 0x5c))) {
          uVar16 = PVar3;
        }
        if (((pBt->db->flags & 0x2000000) == 0) && (uVar16 != 0)) {
          auVar20[0] = -(*puVar5 == 'S');
          auVar20[1] = -(puVar5[1] == 'Q');
          auVar20[2] = -(puVar5[2] == 'L');
          auVar20[3] = -(puVar5[3] == 'i');
          auVar20[4] = -(puVar5[4] == 't');
          auVar20[5] = -(puVar5[5] == 'e');
          auVar20[6] = -(puVar5[6] == ' ');
          auVar20[7] = -(puVar5[7] == 'f');
          auVar20[8] = -(puVar5[8] == 'o');
          auVar20[9] = -(puVar5[9] == 'r');
          auVar20[10] = -(puVar5[10] == 'm');
          auVar20[0xb] = -(puVar5[0xb] == 'a');
          auVar20[0xc] = -(puVar5[0xc] == 't');
          auVar20[0xd] = -(puVar5[0xd] == ' ');
          auVar20[0xe] = -(puVar5[0xe] == '3');
          auVar20[0xf] = -(puVar5[0xf] == '\0');
          uVar12 = 0x1a;
          if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar20[0xf] >> 7) << 0xf) == 0xffff) {
            if (2 < puVar5[0x12]) {
              *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 1;
            }
            if (puVar5[0x13] < 3) {
              local_44 = PVar3;
              if ((puVar5[0x13] == 2) && ((pBt->btsFlags & 0x20) == 0)) {
                local_48 = 0;
                uVar12 = sqlite3PagerOpenWal(pBt->pPager,&local_48);
                if (uVar12 == 0) {
                  if (local_48 != 0) goto LAB_00138f7b;
                  releasePageOne(pMVar6);
                  uVar12 = 0;
                  goto LAB_00138e8f;
                }
              }
              else {
LAB_00138f7b:
                iVar13 = bcmp(puVar5 + 0x15,"@  ",3);
                uVar12 = 0x1a;
                if (iVar13 == 0) {
                  uVar7 = (uint)puVar5[0x10] * 0x100;
                  uVar11 = (uint)puVar5[0x11] * 0x10000;
                  if ((0xffff00ff < (uVar11 + uVar7) - 0x10001) &&
                     (uVar19 = uVar11 | uVar7, ((uVar7 + uVar11) - 1 & uVar19) == 0)) {
                    bVar9 = puVar5[0x14];
                    uVar15 = uVar19 - bVar9;
                    if (uVar19 != *local_40) {
                      releasePageOne(pMVar6);
                      pBt->usableSize = uVar15;
                      pBt->pageSize = uVar19;
                      *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 2;
                      freeTempSpace(pBt);
                      uVar12 = sqlite3PagerSetPagesize(pBt->pPager,local_40,(uint)bVar9);
                      goto LAB_00138e8f;
                    }
                    if ((local_44 < uVar16) &&
                       (uVar16 = local_44, (pBt->db->flags & 0x10000001) != 1)) {
                      uVar12 = sqlite3CorruptError(0x11cac);
                    }
                    else {
                      uVar12 = 0x1a;
                      if (0x1df < uVar15) {
                        *(byte *)&pBt->btsFlags = (byte)pBt->btsFlags | 2;
                        pBt->pageSize = uVar19;
                        pBt->usableSize = uVar15;
                        uVar14 = sqlite3Get4byte(puVar5 + 0x34);
                        pBt->autoVacuum = uVar14 != 0;
                        uVar14 = sqlite3Get4byte(puVar5 + 0x40);
                        pBt->incrVacuum = uVar14 != 0;
                        goto LAB_00138e28;
                      }
                    }
                  }
                }
              }
            }
          }
          releasePageOne(pMVar6);
          pBt->pPage1 = (MemPage *)0x0;
        }
        else {
          uVar15 = pBt->usableSize;
          uVar16 = 0;
LAB_00138e28:
          uVar12 = 0;
          iVar13 = (uVar15 * 0x40 - 0x300) / 0xff - 0x17;
          pBt->maxLocal = (ushort)iVar13;
          uVar10 = (short)((ulong)(uVar15 * 0x20 - 0x180) / 0xff) - 0x17;
          pBt->minLocal = uVar10;
          pBt->maxLeaf = (short)uVar15 - 0x23;
          if (0x7e < (ushort)iVar13) {
            iVar13 = 0x7f;
          }
          pBt->minLeaf = uVar10;
          pBt->max1bytePayload = (u8)iVar13;
          pBt->pPage1 = pMVar6;
          pBt->nPage = uVar16;
LAB_00138e8f:
          uVar11 = 0;
          if (uVar12 == 0) goto LAB_00138c4d;
        }
      }
      else if ((wrflag == 0) || (uVar11 != 0)) {
LAB_00138ef6:
        uVar12 = uVar11;
        if (uVar11 == 0) {
          if ((p->inTrans == '\0') &&
             (pBt->nTransaction = pBt->nTransaction + 1, p->sharable != '\0')) {
            (p->lock).eLock = '\x01';
            (p->lock).pNext = pBt->pLock;
            pBt->pLock = &p->lock;
          }
          bVar9 = 2 - (wrflag == 0);
          p->inTrans = bVar9;
          if (pBt->inTransaction < bVar9) {
            pBt->inTransaction = bVar9;
          }
          if (wrflag == 0) goto LAB_00139188;
          pMVar6 = pBt->pPage1;
          pBt->pWriter = p;
          uVar2 = pBt->btsFlags;
          pBt->btsFlags = (ushort)(1 < wrflag) << 6 | uVar2 & 0xffbf;
          uVar16 = pBt->nPage;
          uVar15 = sqlite3Get4byte(pMVar6->aData + 0x1c);
          if (uVar16 == uVar15) goto LAB_00139188;
          uVar11 = sqlite3PagerWrite(pMVar6->pDbPage);
          if (uVar11 == 0) {
            uVar11 = pBt->nPage;
            *(uint *)(pMVar6->aData + 0x1c) =
                 uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18
            ;
            goto LAB_00139188;
          }
          break;
        }
      }
      else {
        uVar12 = 8;
        if ((pBt->btsFlags & 1) == 0) {
          uVar12 = pPager->errCode;
          if (uVar12 == 0) {
            pPager->subjInMemory = p->db->temp_store == '\x02';
            if (pPager->eState == '\x01') {
              pWal = pPager->pWal;
              if (pWal != (Wal *)0x0) {
                if ((pPager->exclusiveMode != '\0') && (pWal->exclusiveMode == '\0')) {
                  uVar12 = pagerLockDb(pPager,4);
                  if (uVar12 != 0) goto LAB_00138c7e;
                  sqlite3WalExclusiveMode(pPager->pWal,1);
                  pWal = pPager->pWal;
                }
                uVar12 = 8;
                if (pWal->readOnly != '\0') goto LAB_00138f01;
                uVar12 = walLockExclusive(pWal,0,1);
                if (uVar12 != 0) goto LAB_00138c7e;
                pWal->writeLock = '\x01';
                iVar13 = bcmp(&pWal->hdr,*pWal->apWiData,0x30);
                if (iVar13 == 0) goto LAB_00138ed4;
                walUnlockExclusive(pWal,0,1);
                pWal->writeLock = '\0';
                goto LAB_00138c8b;
              }
              uVar12 = pagerLockDb(pPager,2);
              if (uVar12 == 0 && 1 < wrflag) {
                uVar12 = pager_wait_on_lock(pPager,4);
              }
              if (uVar12 != 0) goto LAB_00138c7e;
LAB_00138ed4:
              pPager->eState = '\x02';
              PVar3 = pPager->dbSize;
              pPager->dbHintSize = PVar3;
              pPager->dbFileSize = PVar3;
              pPager->dbOrigSize = PVar3;
              pPager->journalOff = 0;
            }
            uVar11 = newDatabase(pBt);
            goto LAB_00138ef6;
          }
LAB_00138c7e:
          if (uVar12 == 0x205) {
LAB_00138c8b:
            uVar12 = (uint)(pBt->inTransaction != '\0') << 9 | 5;
          }
        }
      }
LAB_00138f01:
      uVar11 = uVar12;
      unlockBtreeIfUnused(pBt);
      if ((((char)uVar11 != '\x05') || (pBt->inTransaction != '\0')) ||
         (iVar13 = btreeInvokeBusyHandler(pBt), iVar13 == 0)) break;
    } while( true );
  }
LAB_001391bf:
  sqlite3BtreeLeave(p);
  return uVar11;
}

Assistant:

static SQLITE_NOINLINE int btreeBeginTrans(
  Btree *p,                 /* The btree in which to start the transaction */
  int wrflag,               /* True to start a write transaction */
  int *pSchemaVersion       /* Put schema version number here, if not NULL */
){
  BtShared *pBt = p->pBt;
  Pager *pPager = pBt->pPager;
  int rc = SQLITE_OK;

  sqlite3BtreeEnter(p);
  btreeIntegrity(p);

  /* If the btree is already in a write-transaction, or it
  ** is already in a read-transaction and a read-transaction
  ** is requested, this is a no-op.
  */
  if( p->inTrans==TRANS_WRITE || (p->inTrans==TRANS_READ && !wrflag) ){
    goto trans_begun;
  }
  assert( pBt->inTransaction==TRANS_WRITE || IfNotOmitAV(pBt->bDoTruncate)==0 );

  if( (p->db->flags & SQLITE_ResetDatabase)
   && sqlite3PagerIsreadonly(pPager)==0
  ){
    pBt->btsFlags &= ~BTS_READ_ONLY;
  }

  /* Write transactions are not possible on a read-only database */
  if( (pBt->btsFlags & BTS_READ_ONLY)!=0 && wrflag ){
    rc = SQLITE_READONLY;
    goto trans_begun;
  }

#ifndef SQLITE_OMIT_SHARED_CACHE
  {
    sqlite3 *pBlock = 0;
    /* If another database handle has already opened a write transaction
    ** on this shared-btree structure and a second write transaction is
    ** requested, return SQLITE_LOCKED.
    */
    if( (wrflag && pBt->inTransaction==TRANS_WRITE)
     || (pBt->btsFlags & BTS_PENDING)!=0
    ){
      pBlock = pBt->pWriter->db;
    }else if( wrflag>1 ){
      BtLock *pIter;
      for(pIter=pBt->pLock; pIter; pIter=pIter->pNext){
        if( pIter->pBtree!=p ){
          pBlock = pIter->pBtree->db;
          break;
        }
      }
    }
    if( pBlock ){
      sqlite3ConnectionBlocked(p->db, pBlock);
      rc = SQLITE_LOCKED_SHAREDCACHE;
      goto trans_begun;
    }
  }
#endif

  /* Any read-only or read-write transaction implies a read-lock on
  ** page 1. So if some other shared-cache client already has a write-lock
  ** on page 1, the transaction cannot be opened. */
  rc = querySharedCacheTableLock(p, SCHEMA_ROOT, READ_LOCK);
  if( SQLITE_OK!=rc ) goto trans_begun;

  pBt->btsFlags &= ~BTS_INITIALLY_EMPTY;
  if( pBt->nPage==0 ) pBt->btsFlags |= BTS_INITIALLY_EMPTY;
  do {
    sqlite3PagerWalDb(pPager, p->db);

#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
    /* If transitioning from no transaction directly to a write transaction,
    ** block for the WRITER lock first if possible. */
    if( pBt->pPage1==0 && wrflag ){
      assert( pBt->inTransaction==TRANS_NONE );
      rc = sqlite3PagerWalWriteLock(pPager, 1);
      if( rc!=SQLITE_BUSY && rc!=SQLITE_OK ) break;
    }
#endif

    /* Call lockBtree() until either pBt->pPage1 is populated or
    ** lockBtree() returns something other than SQLITE_OK. lockBtree()
    ** may return SQLITE_OK but leave pBt->pPage1 set to 0 if after
    ** reading page 1 it discovers that the page-size of the database
    ** file is not pBt->pageSize. In this case lockBtree() will update
    ** pBt->pageSize to the page-size of the file on disk.
    */
    while( pBt->pPage1==0 && SQLITE_OK==(rc = lockBtree(pBt)) );

    if( rc==SQLITE_OK && wrflag ){
      if( (pBt->btsFlags & BTS_READ_ONLY)!=0 ){
        rc = SQLITE_READONLY;
      }else{
        rc = sqlite3PagerBegin(pPager, wrflag>1, sqlite3TempInMemory(p->db));
        if( rc==SQLITE_OK ){
          rc = newDatabase(pBt);
        }else if( rc==SQLITE_BUSY_SNAPSHOT && pBt->inTransaction==TRANS_NONE ){
          /* if there was no transaction opened when this function was
          ** called and SQLITE_BUSY_SNAPSHOT is returned, change the error
          ** code to SQLITE_BUSY. */
          rc = SQLITE_BUSY;
        }
      }
    }

    if( rc!=SQLITE_OK ){
      (void)sqlite3PagerWalWriteLock(pPager, 0);
      unlockBtreeIfUnused(pBt);
    }
  }while( (rc&0xFF)==SQLITE_BUSY && pBt->inTransaction==TRANS_NONE &&
          btreeInvokeBusyHandler(pBt) );
  sqlite3PagerWalDb(pPager, 0);
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
  if( rc==SQLITE_BUSY_TIMEOUT ) rc = SQLITE_BUSY;
#endif

  if( rc==SQLITE_OK ){
    if( p->inTrans==TRANS_NONE ){
      pBt->nTransaction++;
#ifndef SQLITE_OMIT_SHARED_CACHE
      if( p->sharable ){
        assert( p->lock.pBtree==p && p->lock.iTable==1 );
        p->lock.eLock = READ_LOCK;
        p->lock.pNext = pBt->pLock;
        pBt->pLock = &p->lock;
      }
#endif
    }
    p->inTrans = (wrflag?TRANS_WRITE:TRANS_READ);
    if( p->inTrans>pBt->inTransaction ){
      pBt->inTransaction = p->inTrans;
    }
    if( wrflag ){
      MemPage *pPage1 = pBt->pPage1;
#ifndef SQLITE_OMIT_SHARED_CACHE
      assert( !pBt->pWriter );
      pBt->pWriter = p;
      pBt->btsFlags &= ~BTS_EXCLUSIVE;
      if( wrflag>1 ) pBt->btsFlags |= BTS_EXCLUSIVE;
#endif

      /* If the db-size header field is incorrect (as it may be if an old
      ** client has been writing the database file), update it now. Doing
      ** this sooner rather than later means the database size can safely
      ** re-read the database size from page 1 if a savepoint or transaction
      ** rollback occurs within the transaction.
      */
      if( pBt->nPage!=get4byte(&pPage1->aData[28]) ){
        rc = sqlite3PagerWrite(pPage1->pDbPage);
        if( rc==SQLITE_OK ){
          put4byte(&pPage1->aData[28], pBt->nPage);
        }
      }
    }
  }

trans_begun:
  if( rc==SQLITE_OK ){
    if( pSchemaVersion ){
      *pSchemaVersion = get4byte(&pBt->pPage1->aData[40]);
    }
    if( wrflag ){
      /* This call makes sure that the pager has the correct number of
      ** open savepoints. If the second parameter is greater than 0 and
      ** the sub-journal is not already open, then it will be opened here.
      */
      rc = sqlite3PagerOpenSavepoint(pPager, p->db->nSavepoint);
    }
  }

  btreeIntegrity(p);
  sqlite3BtreeLeave(p);
  return rc;
}